

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<kj::AuthenticatedStream>::Maybe
          (Maybe<kj::AuthenticatedStream> *this,Maybe<kj::AuthenticatedStream> *other)

{
  kj::_::NullableValue<kj::AuthenticatedStream>::NullableValue(&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }